

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

iterator __thiscall
ft::vector<int,_ft::allocator<int>_>::erase
          (vector<int,_ft::allocator<int>_> *this,iterator first,iterator last)

{
  iterator piVar1;
  value_type_conflict *local_60;
  iterator it;
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_ft::allocator<int>_> tmp;
  iterator last_local;
  iterator first_local;
  vector<int,_ft::allocator<int>_> *this_local;
  
  tmp._24_8_ = last;
  piVar1 = end(this);
  allocator<int>::allocator(&local_41);
  vector<int,ft::allocator<int>>::vector<int*>
            ((vector<int,ft::allocator<int>> *)local_40,last,piVar1,&local_41,(type *)0x0);
  allocator<int>::~allocator(&local_41);
  while( true ) {
    piVar1 = end(this);
    if (first == piVar1) break;
    pop_back(this);
  }
  local_60 = begin((vector<int,_ft::allocator<int>_> *)local_40);
  while( true ) {
    piVar1 = end((vector<int,_ft::allocator<int>_> *)local_40);
    if (local_60 == piVar1) break;
    push_back(this,local_60);
    local_60 = local_60 + 1;
  }
  ~vector((vector<int,_ft::allocator<int>_> *)local_40);
  return first;
}

Assistant:

iterator    erase(iterator first, iterator last) {
		vector	tmp(last, this->end());
		while (first != this->end())
			this->pop_back();
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
		return first;
	}